

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

string * __thiscall
Catch::TestSpecParser::preprocessPattern_abi_cxx11_
          (string *__return_storage_ptr__,TestSpecParser *this)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,&this->m_patternName);
  lVar5 = 1;
  uVar4 = 0;
  while( true ) {
    puVar1 = (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)puVar2 - (long)puVar1 >> 3) <= uVar4) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_70,__return_storage_ptr__,0,(puVar1[uVar4] + lVar5) - 1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_50,__return_storage_ptr__,
               (this->m_escapeChars).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4] + lVar5,0xffffffffffffffff);
    std::operator+(&local_90,&local_70,&local_50);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__return_storage_ptr__,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + -1;
  }
  if (puVar2 != puVar1) {
    (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"exclude:",(allocator<char> *)&local_70);
  bVar3 = startsWith(__return_storage_ptr__,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (bVar3) {
    this->m_exclusion = true;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_90,__return_storage_ptr__,8,0xffffffffffffffff);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__return_storage_ptr__,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  (this->m_patternName)._M_string_length = 0;
  *(this->m_patternName)._M_dataplus._M_p = '\0';
  this->m_realPatternPos = 0;
  return __return_storage_ptr__;
}

Assistant:

std::string TestSpecParser::preprocessPattern() {
        std::string token = m_patternName;
        for (std::size_t i = 0; i < m_escapeChars.size(); ++i)
            token = token.substr(0, m_escapeChars[i] - i) + token.substr(m_escapeChars[i] - i + 1);
        m_escapeChars.clear();
        if (startsWith(token, "exclude:")) {
            m_exclusion = true;
            token = token.substr(8);
        }

        m_patternName.clear();
        m_realPatternPos = 0;

        return token;
    }